

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O1

void __thiscall
Fl_PostScript_Graphics_Driver::close_rle85(Fl_PostScript_Graphics_Driver *this,void *data)

{
  undefined8 uVar1;
  undefined8 in_RAX;
  int len;
  void *data_00;
  uchar c;
  undefined8 uStack_18;
  
  uStack_18._0_7_ = (undefined7)in_RAX;
  if (*(int *)((long)data + 0x8c) < 1) {
    uVar1 = in_RAX;
    if (*(int *)((long)data + 0x88) == 0) goto LAB_00208876;
    uStack_18 = CONCAT17((char)*(int *)((long)data + 0x88) + -1,(undefined7)uStack_18);
    write85(this,*data,(uchar *)((long)&uStack_18 + 7),1);
    data_00 = *data;
    len = *(int *)((long)data + 0x88);
  }
  else {
    uStack_18 = CONCAT17('\x01' - (char)*(int *)((long)data + 0x8c),(undefined7)uStack_18);
    write85(this,*data,(uchar *)((long)&uStack_18 + 7),1);
    data_00 = *data;
    len = 1;
  }
  write85(this,data_00,(uchar *)((long)data + 8),len);
  uVar1 = uStack_18;
LAB_00208876:
  uStack_18 = uVar1;
  uStack_18 = CONCAT17(0x80,(undefined7)uStack_18);
  write85(this,*data,(uchar *)((long)&uStack_18 + 7),1);
  close85(this,*data);
  operator_delete(data,0x90);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::close_rle85(void *data) // stop doing RLE+ASCII85 encoding
{
  struct_rle85 *rle = (struct_rle85 *)data;
  uchar c;
  if (rle->run_length > 0) { // if within a run, output it
    c = (uchar)(257 - rle->run_length);
    write85(rle->data85, &c, 1);
    write85(rle->data85, rle->buffer, 1);
  } else if (rle->count) { // output the non-run buffer, if not empty
    c = (uchar)(rle->count - 1);
    write85(rle->data85, &c, 1);
    write85(rle->data85, rle->buffer, rle->count);
  }
  c = (uchar)128;
  write85(rle->data85, &c, 1); // output EOD mark
  close85(rle->data85); // close ASCII85 encoding process
  delete rle;
}